

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O1

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  string *psVar1;
  Tolerances *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  ostream *poVar11;
  ostream *poVar12;
  long lVar13;
  char **ppcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  uint *puVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  uint *puVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  char cVar21;
  byte bVar22;
  double dVar23;
  Real RVar24;
  string reason;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  undefined1 local_bb8 [32];
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [13];
  undefined3 uStack_b4b;
  int iStack_b48;
  bool bStack_b44;
  undefined8 local_b40;
  undefined1 local_b38 [16];
  char *local_b28;
  long lStack_b20;
  uint local_b18 [19];
  undefined3 uStack_acb;
  undefined5 uStack_ac8;
  undefined8 local_ac0;
  undefined1 local_ab8 [32];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [13];
  undefined3 uStack_a4b;
  int iStack_a48;
  bool bStack_a44;
  undefined8 local_a40;
  undefined1 local_a38 [32];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [13];
  undefined3 uStack_9cb;
  int iStack_9c8;
  bool bStack_9c4;
  undefined8 local_9c0;
  undefined1 local_9b8 [32];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [13];
  undefined3 uStack_94b;
  int iStack_948;
  bool bStack_944;
  undefined8 local_940;
  undefined1 local_938 [32];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [13];
  undefined3 uStack_8cb;
  int iStack_8c8;
  bool bStack_8c4;
  undefined8 local_8c0;
  undefined1 local_8b8 [32];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [13];
  undefined3 uStack_84b;
  int iStack_848;
  bool bStack_844;
  undefined8 local_840;
  undefined1 local_838 [32];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [13];
  undefined3 uStack_7cb;
  undefined5 uStack_7c8;
  undefined8 local_7c0;
  undefined1 local_7b8 [32];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [13];
  undefined3 uStack_74b;
  undefined5 uStack_748;
  undefined8 local_740;
  undefined1 local_738 [32];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [13];
  undefined3 uStack_6cb;
  undefined5 uStack_6c8;
  undefined8 local_6c0;
  undefined1 local_6b8 [32];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658 [13];
  undefined3 uStack_64b;
  undefined5 uStack_648;
  undefined8 local_640;
  undefined1 local_638 [32];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [13];
  undefined3 uStack_5cb;
  undefined5 uStack_5c8;
  undefined8 local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf8,"");
  local_a40._0_4_ = cpp_dec_float_finite;
  local_a40._4_4_ = 0x1c;
  local_ab8._0_16_ = (undefined1  [16])0x0;
  local_ab8._16_16_ = (undefined1  [16])0x0;
  local_a98 = (undefined1  [16])0x0;
  local_a88 = (undefined1  [16])0x0;
  local_a78 = (undefined1  [16])0x0;
  local_a68 = (undefined1  [16])0x0;
  local_a58 = SUB1613((undefined1  [16])0x0,0);
  uStack_a4b = 0;
  iStack_a48 = 0;
  bStack_a44 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ab8,0.0);
  local_840._0_4_ = cpp_dec_float_finite;
  local_840._4_4_ = 0x1c;
  local_8b8._0_16_ = (undefined1  [16])0x0;
  local_8b8._16_16_ = (undefined1  [16])0x0;
  local_898 = (undefined1  [16])0x0;
  local_888 = (undefined1  [16])0x0;
  local_878 = (undefined1  [16])0x0;
  local_868 = (undefined1  [16])0x0;
  local_858 = SUB1613((undefined1  [16])0x0,0);
  uStack_84b = 0;
  iStack_848 = 0;
  bStack_844 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_8b8,0.0);
  local_8c0._0_4_ = cpp_dec_float_finite;
  local_8c0._4_4_ = 0x1c;
  local_938._0_16_ = (undefined1  [16])0x0;
  local_938._16_16_ = (undefined1  [16])0x0;
  local_918 = (undefined1  [16])0x0;
  local_908 = (undefined1  [16])0x0;
  local_8f8 = (undefined1  [16])0x0;
  local_8e8 = (undefined1  [16])0x0;
  local_8d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_8cb = 0;
  iStack_8c8 = 0;
  bStack_8c4 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_938,0.0);
  local_940._0_4_ = cpp_dec_float_finite;
  local_940._4_4_ = 0x1c;
  local_9b8._0_16_ = (undefined1  [16])0x0;
  local_9b8._16_16_ = (undefined1  [16])0x0;
  local_998 = (undefined1  [16])0x0;
  local_988 = (undefined1  [16])0x0;
  local_978 = (undefined1  [16])0x0;
  local_968 = (undefined1  [16])0x0;
  local_958 = SUB1613((undefined1  [16])0x0,0);
  uStack_94b = 0;
  iStack_948 = 0;
  bStack_944 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_9b8,0.0);
  local_9c0._0_4_ = cpp_dec_float_finite;
  local_9c0._4_4_ = 0x1c;
  local_a38._0_16_ = (undefined1  [16])0x0;
  local_a38._16_16_ = (undefined1  [16])0x0;
  local_a18 = (undefined1  [16])0x0;
  local_a08 = (undefined1  [16])0x0;
  local_9f8 = (undefined1  [16])0x0;
  local_9e8 = (undefined1  [16])0x0;
  local_9d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_9cb = 0;
  iStack_9c8 = 0;
  bStack_9c4 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_a38,0.0);
  local_5c0._0_4_ = cpp_dec_float_finite;
  local_5c0._4_4_ = 0x1c;
  local_638._0_16_ = (undefined1  [16])0x0;
  local_638._16_16_ = (undefined1  [16])0x0;
  local_618 = (undefined1  [16])0x0;
  local_608 = (undefined1  [16])0x0;
  local_5f8 = (undefined1  [16])0x0;
  local_5e8 = (undefined1  [16])0x0;
  local_5d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_5cb = 0;
  uStack_5c8._0_4_ = 0;
  uStack_5c8._4_1_ = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_638,0.0);
  local_640._0_4_ = cpp_dec_float_finite;
  local_640._4_4_ = 0x1c;
  local_6b8._0_16_ = (undefined1  [16])0x0;
  local_6b8._16_16_ = (undefined1  [16])0x0;
  local_698 = (undefined1  [16])0x0;
  local_688 = (undefined1  [16])0x0;
  local_678 = (undefined1  [16])0x0;
  local_668 = (undefined1  [16])0x0;
  local_658 = SUB1613((undefined1  [16])0x0,0);
  uStack_64b = 0;
  uStack_648._0_4_ = 0;
  uStack_648._4_1_ = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_6b8,0.0);
  local_6c0._0_4_ = cpp_dec_float_finite;
  local_6c0._4_4_ = 0x1c;
  local_738._0_16_ = (undefined1  [16])0x0;
  local_738._16_16_ = (undefined1  [16])0x0;
  local_718 = (undefined1  [16])0x0;
  local_708 = (undefined1  [16])0x0;
  local_6f8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_6d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_6cb = 0;
  uStack_6c8._0_4_ = 0;
  uStack_6c8._4_1_ = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_738,0.0);
  local_740._0_4_ = cpp_dec_float_finite;
  local_740._4_4_ = 0x1c;
  local_7b8._0_16_ = (undefined1  [16])0x0;
  local_7b8._16_16_ = (undefined1  [16])0x0;
  local_798 = (undefined1  [16])0x0;
  local_788 = (undefined1  [16])0x0;
  local_778 = (undefined1  [16])0x0;
  local_768 = (undefined1  [16])0x0;
  local_758 = SUB1613((undefined1  [16])0x0,0);
  uStack_74b = 0;
  uStack_748._0_4_ = 0;
  uStack_748._4_1_ = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_7b8,0.0);
  local_b40._0_4_ = cpp_dec_float_finite;
  local_b40._4_4_ = 0x1c;
  local_bb8._0_16_ = (undefined1  [16])0x0;
  local_bb8._16_16_ = (undefined1  [16])0x0;
  local_b98 = (undefined1  [16])0x0;
  local_b88 = (undefined1  [16])0x0;
  local_b78 = (undefined1  [16])0x0;
  local_b68 = (undefined1  [16])0x0;
  local_b58 = SUB1613((undefined1  [16])0x0,0);
  uStack_b4b = 0;
  iStack_b48 = 0;
  bStack_b44 = false;
  poVar12 = (soplex->spxout).m_streams[3];
  psVar1 = &this->validatesolution;
  iVar9 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar9 == 0) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_bb8,
               soplex->_currentSettings->_realParamValues[6]);
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar9 == 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_bb8,
                 (double)((ulong)soplex->_currentSettings->_realParamValues[6] ^ (ulong)DAT_00601010
                         ));
    }
    else {
      dVar23 = atof((psVar1->_M_dataplus)._M_p);
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_bb8,dVar23);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b38,soplex);
  local_130.fpclass = cpp_dec_float_finite;
  local_130.prec_elem = 0x1c;
  local_130.exp = 0;
  local_130.neg = false;
  puVar16 = (uint *)local_bb8;
  pcVar18 = &local_130;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar18->data)._M_elems[0] = *puVar16;
    puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar22 * -8 + 4);
  }
  local_130.exp = iStack_b48;
  local_130.neg = bStack_b44;
  local_130.fpclass = (fpclass_type)local_b40;
  local_130.prec_elem = local_b40._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_130,(cpp_dec_float<200U,_int,_void> *)local_b38);
  uVar5 = local_130._120_8_;
  iVar9 = local_130.exp;
  cVar21 = local_130.neg;
  if (local_130.neg == true) {
    cVar21 = local_130.fpclass == cpp_dec_float_finite && local_130.data._M_elems[0] == 0;
  }
  local_ab8._0_4_ = local_130.data._M_elems[0];
  puVar16 = local_130.data._M_elems + 1;
  puVar19 = (uint *)(local_ab8 + 4);
  for (lVar13 = 0x1b; uVar6 = local_130._120_8_, lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
  }
  iStack_a48 = iVar9;
  bStack_a44 = (bool)cVar21;
  local_130.fpclass = (fpclass_type)uVar5;
  local_130.prec_elem = SUB84(uVar5,4);
  local_a40._0_4_ = local_130.fpclass;
  local_a40._4_4_ = local_130.prec_elem;
  local_130._120_8_ = uVar6;
  if (soplex->_status != INForUNBD) goto LAB_004c4fc0;
  if (((fpclass_type)local_b40 == cpp_dec_float_NaN) ||
     (dVar23 = soplex->_currentSettings->_realParamValues[6], NAN(dVar23))) {
LAB_004c4f3e:
    if (((fpclass_type)local_b40 == cpp_dec_float_NaN) ||
       (dVar23 = soplex->_currentSettings->_realParamValues[6], NAN(dVar23))) goto LAB_004c4fc0;
    local_ac0._0_4_ = cpp_dec_float_finite;
    local_ac0._4_4_ = 0x1c;
    local_b38._0_8_ = (char **)0x0;
    local_b38._8_8_ = 0;
    local_b28 = (char *)0x0;
    lStack_b20 = 0;
    local_b18[0] = 0;
    local_b18[1] = 0;
    local_b18[2] = 0;
    local_b18[3] = 0;
    local_b18[4] = 0;
    local_b18[5] = 0;
    local_b18[6] = 0;
    local_b18[7] = 0;
    local_b18[8] = 0;
    local_b18[9] = 0;
    local_b18[10] = 0;
    local_b18[0xb] = 0;
    local_b18[0xc] = 0;
    local_b18[0xd] = 0;
    local_b18[0xe] = 0;
    local_b18[0xf] = 0;
    local_b18[0x10] = 0;
    local_b18[0x11] = 0;
    stack0xfffffffffffff530 = 0;
    uStack_acb = 0;
    uStack_ac8._0_4_ = 0;
    uStack_ac8._4_1_ = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_b38,-dVar23);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      ((cpp_dec_float<200U,_int,_void> *)local_bb8,
                       (cpp_dec_float<200U,_int,_void> *)local_b38);
    if (iVar9 != 0) goto LAB_004c4fc0;
  }
  else {
    local_ac0._0_4_ = cpp_dec_float_finite;
    local_ac0._4_4_ = 0x1c;
    local_b38._0_8_ = (char **)0x0;
    local_b38._8_8_ = 0;
    local_b28 = (char *)0x0;
    lStack_b20 = 0;
    local_b18[0] = 0;
    local_b18[1] = 0;
    local_b18[2] = 0;
    local_b18[3] = 0;
    local_b18[4] = 0;
    local_b18[5] = 0;
    local_b18[6] = 0;
    local_b18[7] = 0;
    local_b18[8] = 0;
    local_b18[9] = 0;
    local_b18[10] = 0;
    local_b18[0xb] = 0;
    local_b18[0xc] = 0;
    local_b18[0xd] = 0;
    local_b18[0xe] = 0;
    local_b18[0xf] = 0;
    local_b18[0x10] = 0;
    local_b18[0x11] = 0;
    stack0xfffffffffffff530 = 0;
    uStack_acb = 0;
    uStack_ac8._0_4_ = 0;
    uStack_ac8._4_1_ = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_b38,dVar23);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      ((cpp_dec_float<200U,_int,_void> *)local_bb8,
                       (cpp_dec_float<200U,_int,_void> *)local_b38);
    if (iVar9 != 0) goto LAB_004c4f3e;
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ab8,0.0);
LAB_004c4fc0:
  puVar16 = (uint *)local_ab8;
  pnVar17 = &local_1b0;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar17->m_backend).data._M_elems[0] = *puVar16;
    puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = iStack_a48;
  local_1b0.m_backend.neg = bStack_a44;
  local_1b0.m_backend.fpclass = (fpclass_type)local_a40;
  local_1b0.m_backend.prec_elem = local_a40._4_4_;
  local_7c0._0_4_ = cpp_dec_float_finite;
  local_7c0._4_4_ = 0x1c;
  local_838._0_16_ = (undefined1  [16])0x0;
  local_838._16_16_ = (undefined1  [16])0x0;
  local_818 = (undefined1  [16])0x0;
  local_808 = (undefined1  [16])0x0;
  local_7f8 = (undefined1  [16])0x0;
  local_7e8 = (undefined1  [16])0x0;
  local_7d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_7cb = 0;
  uStack_7c8._0_4_ = 0;
  uStack_7c8._4_1_ = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_838,0.0);
  pnVar17 = &this->validatetolerance;
  pnVar15 = pnVar17;
  pnVar20 = &local_b0;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + (ulong)bVar22 * -8 + 4);
    pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
  local_b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
  local_b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
  local_b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
  bVar7 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_838,&local_b0);
  if (!bVar7) {
    std::__cxx11::string::append((char *)&local_bf8);
  }
  if (soplex->_status == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_8b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_638);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_938,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_6b8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation
              (soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_9b8,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_738);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_a38,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_7b8);
    puVar16 = (uint *)local_8b8;
    pnVar15 = &local_230;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = *puVar16;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = iStack_848;
    local_230.m_backend.neg = bStack_844;
    local_230.m_backend.fpclass = (fpclass_type)local_840;
    local_230.m_backend.prec_elem = local_840._4_4_;
    pnVar15 = pnVar17;
    pnVar20 = &local_2b0;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + (ulong)bVar22 * -8 + 4);
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_2b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_2b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_2b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar2 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    RVar24 = Tolerances::epsilon(pTVar2);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_230,&local_2b0,RVar24);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_bf8);
      bVar7 = false;
    }
    puVar16 = (uint *)local_938;
    pnVar15 = &local_330;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = *puVar16;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = iStack_8c8;
    local_330.m_backend.neg = bStack_8c4;
    local_330.m_backend.fpclass = (fpclass_type)local_8c0;
    local_330.m_backend.prec_elem = local_8c0._4_4_;
    pnVar15 = pnVar17;
    pnVar20 = &local_3b0;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + (ulong)bVar22 * -8 + 4);
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_3b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_3b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_3b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_3b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar2 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    RVar24 = Tolerances::epsilon(pTVar2);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_330,&local_3b0,RVar24);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_bf8);
      bVar7 = false;
    }
    puVar16 = (uint *)local_9b8;
    pnVar15 = &local_430;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = *puVar16;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_430.m_backend.exp = iStack_948;
    local_430.m_backend.neg = bStack_944;
    local_430.m_backend.fpclass = (fpclass_type)local_940;
    local_430.m_backend.prec_elem = local_940._4_4_;
    pnVar15 = pnVar17;
    pnVar20 = &local_4b0;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + (ulong)bVar22 * -8 + 4);
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_4b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_4b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_4b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_4b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar2 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    RVar24 = Tolerances::epsilon(pTVar2);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_430,&local_4b0,RVar24);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_bf8);
      bVar7 = false;
    }
    puVar16 = (uint *)local_a38;
    pnVar15 = &local_530;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = *puVar16;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_530.m_backend.exp = iStack_9c8;
    local_530.m_backend.neg = bStack_9c4;
    local_530.m_backend.fpclass = (fpclass_type)local_9c0;
    local_530.m_backend.prec_elem = local_9c0._4_4_;
    pnVar15 = &local_5b0;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + (ulong)bVar22 * -8 + 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_5b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_5b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_5b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_5b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar2 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    RVar24 = Tolerances::epsilon(pTVar2);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_530,&local_5b0,RVar24);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_bf8);
      bVar7 = false;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Validation          :",0x15);
  if (bVar7 == false) {
    local_bf8._M_dataplus._M_p[local_bf8._M_string_length - 2] = ']';
    std::operator+(&local_bd8," Fail [",&local_bf8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_bd8);
    ppcVar14 = (char **)(plVar10 + 2);
    if ((char **)*plVar10 == ppcVar14) {
      local_b28 = *ppcVar14;
      lStack_b20 = plVar10[3];
      local_b38._0_8_ = &local_b28;
    }
    else {
      local_b28 = *ppcVar14;
      local_b38._0_8_ = (char **)*plVar10;
    }
    local_b38._8_8_ = plVar10[1];
    *plVar10 = (long)ppcVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,(char *)local_b38._0_8_,local_b38._8_8_);
    if ((char **)local_b38._0_8_ != &local_b28) {
      operator_delete((void *)local_b38._0_8_,(ulong)(local_b28 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
      operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," Success\n",9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   Objective        : ",0x16);
  lVar13 = *(long *)poVar12;
  lVar4 = *(long *)(lVar13 + -0x18);
  *(uint *)(poVar12 + lVar4 + 0x18) = *(uint *)(poVar12 + lVar4 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
  poVar11 = boost::multiprecision::operator<<
                      (poVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_ab8);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   Bound            : ",0x16);
  lVar13 = *(long *)poVar12;
  lVar4 = *(long *)(lVar13 + -0x18);
  *(uint *)(poVar12 + lVar4 + 0x18) = *(uint *)(poVar12 + lVar4 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
  poVar11 = boost::multiprecision::operator<<
                      (poVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_8b8);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   Row              : ",0x16);
  lVar13 = *(long *)poVar12;
  lVar4 = *(long *)(lVar13 + -0x18);
  *(uint *)(poVar12 + lVar4 + 0x18) = *(uint *)(poVar12 + lVar4 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
  poVar11 = boost::multiprecision::operator<<
                      (poVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_938);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   Reduced Cost     : ",0x16);
  lVar13 = *(long *)poVar12;
  lVar4 = *(long *)(lVar13 + -0x18);
  *(uint *)(poVar12 + lVar4 + 0x18) = *(uint *)(poVar12 + lVar4 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
  poVar11 = boost::multiprecision::operator<<
                      (poVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_9b8);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   Dual             : ",0x16);
  lVar13 = *(long *)poVar12;
  lVar4 = *(long *)(lVar13 + -0x18);
  *(uint *)(poVar12 + lVar4 + 0x18) = *(uint *)(poVar12 + lVar4 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
  poVar12 = boost::multiprecision::operator<<
                      (poVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_a38);
  *(uint *)(poVar12 + *(long *)(*(long *)poVar12 + -0x18) + 0x18) =
       *(uint *)(poVar12 + *(long *)(*(long *)poVar12 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}